

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall ary::PlaneTracker::~PlaneTracker(PlaneTracker *this)

{
  PlaneTracker *this_local;
  
  ~PlaneTracker(this);
  operator_delete(this);
  return;
}

Assistant:

PlaneTracker::~PlaneTracker() {

}